

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

void normalizeFloat128Subnormal
               (uint64_t aSig0,uint64_t aSig1,int32_t *zExpPtr,uint64_t *zSig0Ptr,uint64_t *zSig1Ptr
               )

{
  long lVar1;
  uint64_t uVar2;
  byte bVar3;
  int iVar4;
  
  if (aSig0 == 0) {
    if (aSig1 == 0) {
      bVar3 = 0x40;
    }
    else {
      lVar1 = 0x3f;
      if (aSig1 != 0) {
        for (; aSig1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      bVar3 = (byte)lVar1 ^ 0x3f;
    }
    bVar3 = bVar3 - 0xf;
    if ((char)bVar3 < '\0') {
      *zSig0Ptr = aSig1 >> (-bVar3 & 0x3f);
      uVar2 = aSig1 << (bVar3 & 0x3f);
    }
    else {
      *zSig0Ptr = aSig1 << (bVar3 & 0x3f);
      uVar2 = 0;
    }
    *zSig1Ptr = uVar2;
    iVar4 = -0x3f - (char)bVar3;
  }
  else {
    lVar1 = 0x3f;
    if (aSig0 != 0) {
      for (; aSig0 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar4 = ((uint)lVar1 ^ 0x3f) * 0x1000000 + -0xf000000;
    bVar3 = (byte)((uint)iVar4 >> 0x18);
    *zSig1Ptr = aSig1 << (bVar3 & 0x3f);
    if (iVar4 != 0) {
      aSig0 = aSig0 << (bVar3 & 0x3f) | aSig1 >> (-bVar3 & 0x3f);
    }
    *zSig0Ptr = aSig0;
    iVar4 = 1 - (iVar4 >> 0x18);
  }
  *zExpPtr = iVar4;
  return;
}

Assistant:

static void
 normalizeFloat128Subnormal(
     uint64_t aSig0,
     uint64_t aSig1,
     int32_t *zExpPtr,
     uint64_t *zSig0Ptr,
     uint64_t *zSig1Ptr
 )
{
    int8_t shiftCount;

    if ( aSig0 == 0 ) {
        shiftCount = clz64(aSig1) - 15;
        if ( shiftCount < 0 ) {
            *zSig0Ptr = aSig1>>( - shiftCount );
            *zSig1Ptr = aSig1<<( shiftCount & 63 );
        }
        else {
            *zSig0Ptr = aSig1<<shiftCount;
            *zSig1Ptr = 0;
        }
        *zExpPtr = - shiftCount - 63;
    }
    else {
        shiftCount = clz64(aSig0) - 15;
        shortShift128Left( aSig0, aSig1, shiftCount, zSig0Ptr, zSig1Ptr );
        *zExpPtr = 1 - shiftCount;
    }

}